

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdstddht.cc
# Opt level: O0

void bdStdPrintNodeId(ostream *out,bdNodeId *a)

{
  undefined1 local_38 [8];
  string s;
  bdNodeId *a_local;
  ostream *out_local;
  
  s.field_2._8_8_ = a;
  std::__cxx11::string::string((string *)local_38);
  bdStdPrintNodeId((string *)local_38,(bdNodeId *)s.field_2._8_8_,true);
  std::operator<<(out,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void bdStdPrintNodeId(std::ostream &out, const bdNodeId *a) {
	std::string s;
	bdStdPrintNodeId(s, a, true);
	out << s;
}